

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hxx
# Opt level: O0

void miniros::serialization::Serializer<rosgraph_msgs::Log_<std::allocator<void>>>::
     allInOne<miniros::serialization::OStream,rosgraph_msgs::Log_<std::allocator<void>>const&>
               (OStream *stream,Log_<std::allocator<void>_> *m)

{
  OStream *in_RSI;
  Header_<std::allocator<void>_> *in_stack_ffffffffffffff68;
  
  serialize<std_msgs::Header_<std::allocator<void>>,miniros::serialization::OStream>
            (in_RSI,in_stack_ffffffffffffff68);
  serialize<signed_char,miniros::serialization::OStream>(in_RSI,(char *)in_stack_ffffffffffffff68);
  serialize<std::__cxx11::string,miniros::serialization::OStream>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff68);
  serialize<std::__cxx11::string,miniros::serialization::OStream>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff68);
  serialize<std::__cxx11::string,miniros::serialization::OStream>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff68);
  serialize<std::__cxx11::string,miniros::serialization::OStream>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff68);
  serialize<unsigned_int,miniros::serialization::OStream>(in_RSI,&in_stack_ffffffffffffff68->seq);
  serialize<std::__cxx11::string,std::allocator<std::__cxx11::string>,miniros::serialization::OStream>
            (in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

inline static void allInOne(Stream& stream, T m)
    {
      stream.next(m.header);
      stream.next(m.level);
      stream.next(m.name);
      stream.next(m.msg);
      stream.next(m.file);
      stream.next(m.function);
      stream.next(m.line);
      stream.next(m.topics);
    }